

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

bool __thiscall
duckdb::CatalogSet::RenameEntryInternal
          (CatalogSet *this,CatalogTransaction transaction,CatalogEntry *old,string *new_name,
          AlterInfo *alter_info,unique_lock<std::mutex> *read_lock)

{
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  CatalogTransaction transaction_02;
  CatalogTransaction transaction_03;
  transaction_t tVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  bool bVar2;
  int iVar3;
  ClientContext *pCVar4;
  CatalogEntry *pCVar5;
  undefined4 extraout_var;
  pointer pIVar6;
  CatalogException *this_00;
  CatalogSet *this_01;
  bool visible;
  undefined7 uStack_d7;
  CatalogType local_c9;
  string *local_c8;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_c0;
  string local_b8;
  transaction_t local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_88;
  AlterInfo *local_80;
  optional_ptr<duckdb::CatalogEntry,_true> entry_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90 = &old->name;
  local_80 = alter_info;
  pCVar4 = optional_ptr<duckdb::ClientContext,_true>::operator*(&transaction.context);
  local_c8 = new_name;
  entry_value = CatalogEntryMap::GetEntry(&this->map,new_name);
  if (entry_value.ptr != (CatalogEntry *)0x0) {
    local_98 = transaction.start_time;
    local_b8.field_2._M_allocated_capacity = (size_type)transaction.transaction.ptr;
    local_b8.field_2._8_8_ = transaction.transaction_id;
    local_b8._M_dataplus._M_p = (pointer)transaction.db.ptr;
    local_b8._M_string_length = (size_type)transaction.context.ptr;
    this_01 = (CatalogSet *)&entry_value;
    pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator*
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)this_01);
    transaction_00.context.ptr = (ClientContext *)local_b8._M_string_length;
    transaction_00.db.ptr = (DatabaseInstance *)local_b8._M_dataplus._M_p;
    transaction_00.transaction.ptr = (Transaction *)local_b8.field_2._M_allocated_capacity;
    transaction_00.transaction_id = local_b8.field_2._8_8_;
    transaction_00.start_time = local_98;
    pCVar5 = GetEntryForTransaction(this_01,transaction_00,pCVar5,&visible);
    if (pCVar5->deleted == false) {
      (*old->_vptr_CatalogEntry[4])(old,pCVar4,local_80);
      this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_b8,
                 "Could not rename \"%s\" to \"%s\": another entry with this name already exists!",
                 (allocator *)&visible);
      ::std::__cxx11::string::string((string *)&local_50,(string *)local_90);
      ::std::__cxx11::string::string((string *)&local_70,(string *)local_c8);
      CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                (this_00,&local_b8,&local_50,&local_70);
      __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  visible = true;
  iVar3 = (*old->_vptr_CatalogEntry[0xb])(old);
  name = local_90;
  make_uniq<duckdb::InCatalogEntry,duckdb::CatalogType,duckdb::Catalog&,std::__cxx11::string&>
            ((duckdb *)&local_b8,&visible,(Catalog *)CONCAT44(extraout_var,iVar3),local_90);
  tVar1 = transaction.transaction_id;
  pIVar6 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
           operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                       *)&local_b8);
  LOCK();
  (pIVar6->super_CatalogEntry).timestamp.super___atomic_base<unsigned_long>._M_i = tVar1;
  UNLOCK();
  pIVar6 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
           operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                       *)&local_b8);
  (pIVar6->super_CatalogEntry).deleted = false;
  pIVar6 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
           operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                       *)&local_b8);
  local_c0._M_head_impl = (InCatalogEntry *)local_b8._M_dataplus._M_p;
  (pIVar6->super_CatalogEntry).set.ptr = this;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  transaction_01.context.ptr = transaction.context.ptr;
  transaction_01.db.ptr = transaction.db.ptr;
  transaction_01.transaction.ptr = transaction.transaction.ptr;
  transaction_01.transaction_id = transaction.transaction_id;
  transaction_01.start_time = transaction.start_time;
  bVar2 = CreateEntryInternal(this,transaction_01,name,
                              (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                               *)&local_c0,read_lock,false);
  if ((DatabaseInstance *)local_c0._M_head_impl != (DatabaseInstance *)0x0) {
    (*(code *)(((((weak_ptr<duckdb::DatabaseInstance,_true> *)
                 &((local_c0._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry)->internal).
                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
              super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)();
  }
  local_c0._M_head_impl = (InCatalogEntry *)0x0;
  if (bVar2) {
    transaction_02.context.ptr = transaction.context.ptr;
    transaction_02.db.ptr = transaction.db.ptr;
    transaction_02.transaction.ptr = transaction.transaction.ptr;
    transaction_02.transaction_id = transaction.transaction_id;
    transaction_02.start_time = transaction.start_time;
    bVar2 = DropEntryInternal(this,transaction_02,name,false);
    if (bVar2) {
      local_c9 = RENAMED_ENTRY;
      make_uniq<duckdb::InCatalogEntry,duckdb::CatalogType,duckdb::DuckCatalog&,std::__cxx11::string_const&>
                ((duckdb *)&visible,&local_c9,this->catalog,local_c8);
      tVar1 = transaction.transaction_id;
      pIVar6 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
               ::operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                             *)&visible);
      LOCK();
      (pIVar6->super_CatalogEntry).timestamp.super___atomic_base<unsigned_long>._M_i = tVar1;
      UNLOCK();
      pIVar6 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
               ::operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                             *)&visible);
      (pIVar6->super_CatalogEntry).deleted = false;
      pIVar6 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
               ::operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                             *)&visible);
      local_88._M_head_impl = _visible;
      (pIVar6->super_CatalogEntry).set.ptr = this;
      _visible = (InCatalogEntry *)0x0;
      transaction_03.context.ptr = transaction.context.ptr;
      transaction_03.db.ptr = transaction.db.ptr;
      transaction_03.transaction.ptr = transaction.transaction.ptr;
      transaction_03.transaction_id = transaction.transaction_id;
      transaction_03.start_time = transaction.start_time;
      bVar2 = CreateEntryInternal(this,transaction_03,local_c8,
                                  (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                                   *)&local_88,read_lock,true);
      if (local_88._M_head_impl != (InCatalogEntry *)0x0) {
        (*((local_88._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
      }
      if (_visible != (InCatalogEntry *)0x0) {
        (*(_visible->super_CatalogEntry)._vptr_CatalogEntry[1])();
      }
      goto LAB_01608b65;
    }
  }
  bVar2 = false;
LAB_01608b65:
  if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
  }
  return bVar2;
}

Assistant:

bool CatalogSet::RenameEntryInternal(CatalogTransaction transaction, CatalogEntry &old, const string &new_name,
                                     AlterInfo &alter_info, unique_lock<mutex> &read_lock) {
	auto &original_name = old.name;

	auto &context = *transaction.context;
	auto entry_value = map.GetEntry(new_name);
	if (entry_value) {
		auto &existing_entry = GetEntryForTransaction(transaction, *entry_value);
		if (!existing_entry.deleted) {
			// There exists an entry by this name that is not deleted
			old.UndoAlter(context, alter_info);
			throw CatalogException("Could not rename \"%s\" to \"%s\": another entry with this name already exists!",
			                       original_name, new_name);
		}
	}

	// Add a RENAMED_ENTRY before adding a DELETED_ENTRY, this makes it so that when this is committed
	// we know that this was not a DROP statement.
	auto renamed_tombstone = make_uniq<InCatalogEntry>(CatalogType::RENAMED_ENTRY, old.ParentCatalog(), original_name);
	renamed_tombstone->timestamp = transaction.transaction_id;
	renamed_tombstone->deleted = false;
	renamed_tombstone->set = this;
	if (!CreateEntryInternal(transaction, original_name, std::move(renamed_tombstone), read_lock,
	                         /*should_be_empty = */ false)) {
		return false;
	}
	if (!DropEntryInternal(transaction, original_name, false)) {
		return false;
	}

	// Add the renamed entry
	// Start this off with a RENAMED_ENTRY node, for commit/cleanup/rollback purposes
	auto renamed_node = make_uniq<InCatalogEntry>(CatalogType::RENAMED_ENTRY, catalog, new_name);
	renamed_node->timestamp = transaction.transaction_id;
	renamed_node->deleted = false;
	renamed_node->set = this;
	return CreateEntryInternal(transaction, new_name, std::move(renamed_node), read_lock);
}